

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O0

bool __thiscall
cpptrace::detail::libdwarf::die_object::has_attr(die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  int iVar1;
  byte bVar2;
  undefined7 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int *local_20;
  int local_18;
  Dwarf_Half local_12;
  Dwarf_Bool present;
  Dwarf_Half attr_num_local;
  die_object *this_local;
  
  local_18 = 0;
  local_20 = &local_18;
  local_12 = attr_num;
  _present = this;
  iVar1 = wrap<Dwarf_Die_s_*,_unsigned_short,_int_*,_Dwarf_Error_s_**,_Dwarf_Die_s_*const_&,_unsigned_short_&,_int_*,_0>
                    (this,dwarf_hasattr,&this->die,&local_12,&local_20);
  bVar2 = iVar1 == 0;
  source_location::source_location
            ((source_location *)&stack0xffffffffffffffd0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
             ,0xae);
  location.file._7_1_ = bVar2;
  location.file._0_7_ = in_stack_ffffffffffffffc8;
  location._8_8_ = in_stack_ffffffffffffffd0;
  assert_impl<bool>((detail *)(ulong)(bVar2 & 1),true,0x33de4d,
                    "bool cpptrace::detail::libdwarf::die_object::has_attr(Dwarf_Half) const",
                    in_stack_ffffffffffffffd0,location);
  return local_18 != 0;
}

Assistant:

bool has_attr(Dwarf_Half attr_num) const {
            Dwarf_Bool present = false;
            VERIFY(wrap(dwarf_hasattr, die, attr_num, &present) == DW_DLV_OK);
            return present;
        }